

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O3

void ps_expand_file_config(ps_config_t *config,char *arg,char *hmmdir,char *file)

{
  int iVar1;
  char *pcVar2;
  char *path;
  
  pcVar2 = ps_config_str(config,arg);
  if (pcVar2 != (char *)0x0) {
    return;
  }
  path = string_join(hmmdir,"/",file,0);
  iVar1 = file_exists(path);
  pcVar2 = path;
  if (iVar1 == 0) {
    pcVar2 = (char *)0x0;
  }
  ps_config_set_str(config,arg,pcVar2);
  ckd_free(path);
  return;
}

Assistant:

static void
ps_expand_file_config(ps_config_t *config, const char *arg,
	              const char *hmmdir, const char *file)
{
    const char *val;
    if ((val = ps_config_str(config, arg)) == NULL) {
        char *tmp = string_join(hmmdir, "/", file, NULL);
        if (file_exists(tmp))
	    ps_config_set_str(config, arg, tmp);
	else
	    ps_config_set_str(config, arg, NULL);
        ckd_free(tmp);
    }
}